

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

uchar fts5yy_find_shift_action(uchar iLookAhead,uchar stateno)

{
  int i;
  uchar stateno_local;
  uchar iLookAhead_local;
  uchar local_1;
  
  local_1 = stateno;
  if (stateno < 0x23) {
    if ("\x10\x11\x12\x13\x14\x16\x16\x18\x18\x11\x12\x13\x14\a\x16\t\x18\x11\x12\x13\x14\t\x16\t\x18\r\x11\x12\x13\x14\x1a\x16\x18\x18\x11\x12\x13\x14\x0f\x16\t\x18\x11\x12\x13\x14\x1a\x16\x15\x18\x06\a\t\t\n\f\f\x06\a\x15\t\x18\x19\f\x12\x05\x14\x0e\x16\x05\x18\x03\x01\x02\x03\x01\x02\x03"
        [(int)((uint)iLookAhead +
              (uint)",,,,,,3M+\f\x0eSR\x0e\x17\x17\x1f\x1fGJNQV[\x0655<@D5W\\5]"[stateno])] ==
        iLookAhead) {
      local_1 = "Q\x14`\x06\x1ccb\x1a\x1a\x12`\x06\x1c\x11b8\x1a\x13`\x06\x1c\x0eb\x0e\x1a\x1f\\`\x06\x1clb\x19\x1a\x15`\x06\x1cNb:\x1a\x1d`\x06\x1ckb\x16\x1a\x18\x10\f\v\x01\r\r\x18\x10\x17\v!\"\ra\b\x1b b\a\x1a\x03\x04\x05\x03\x04\x05\x03S\x04\x05\x03?\x05\x03>\f\x02V\r\t\x1e\n\n69KNN59\x0fRRG"
                [(int)((uint)iLookAhead +
                      (uint)",,,,,,3M+\f\x0eSR\x0e\x17\x17\x1f\x1fGJNQV[\x0655<@D5W\\5]"[stateno])];
    }
    else {
      local_1 = "PPPPPP_PPiPnnPnnPPPPP[PPPedPPZgPPhP"[stateno];
    }
  }
  return local_1;
}

Assistant:

static fts5YYACTIONTYPE fts5yy_find_shift_action(
  fts5YYCODETYPE iLookAhead,    /* The look-ahead token */
  fts5YYACTIONTYPE stateno      /* Current state number */
){
  int i;

  if( stateno>fts5YY_MAX_SHIFT ) return stateno;
  assert( stateno <= fts5YY_SHIFT_COUNT );
#if defined(fts5YYCOVERAGE)
  fts5yycoverage[stateno][iLookAhead] = 1;
#endif
  do{
    i = fts5yy_shift_ofst[stateno];
    assert( i>=0 );
    assert( i<=fts5YY_ACTTAB_COUNT );
    assert( i+fts5YYNFTS5TOKEN<=(int)fts5YY_NLOOKAHEAD );
    assert( iLookAhead!=fts5YYNOCODE );
    assert( iLookAhead < fts5YYNFTS5TOKEN );
    i += iLookAhead;
    assert( i<(int)fts5YY_NLOOKAHEAD );
    if( fts5yy_lookahead[i]!=iLookAhead ){
#ifdef fts5YYFALLBACK
      fts5YYCODETYPE iFallback;            /* Fallback token */
      assert( iLookAhead<sizeof(fts5yyFallback)/sizeof(fts5yyFallback[0]) );
      iFallback = fts5yyFallback[iLookAhead];
      if( iFallback!=0 ){
#ifndef NDEBUG
        if( fts5yyTraceFILE ){
          fprintf(fts5yyTraceFILE, "%sFALLBACK %s => %s\n",
             fts5yyTracePrompt, fts5yyTokenName[iLookAhead], fts5yyTokenName[iFallback]);
        }
#endif
        assert( fts5yyFallback[iFallback]==0 ); /* Fallback loop must terminate */
        iLookAhead = iFallback;
        continue;
      }
#endif
#ifdef fts5YYWILDCARD
      {
        int j = i - iLookAhead + fts5YYWILDCARD;
        assert( j<(int)(sizeof(fts5yy_lookahead)/sizeof(fts5yy_lookahead[0])) );
        if( fts5yy_lookahead[j]==fts5YYWILDCARD && iLookAhead>0 ){
#ifndef NDEBUG
          if( fts5yyTraceFILE ){
            fprintf(fts5yyTraceFILE, "%sWILDCARD %s => %s\n",
               fts5yyTracePrompt, fts5yyTokenName[iLookAhead],
               fts5yyTokenName[fts5YYWILDCARD]);
          }
#endif /* NDEBUG */
          return fts5yy_action[j];
        }
      }
#endif /* fts5YYWILDCARD */
      return fts5yy_default[stateno];
    }else{
      assert( i>=0 && i<(int)(sizeof(fts5yy_action)/sizeof(fts5yy_action[0])) );
      return fts5yy_action[i];
    }
  }while(1);
}